

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void webots_velocity_message_size_invoker(void)

{
  undefined1 *puVar1;
  ios_base *this;
  string local_1e8;
  undefined7 uStack_1e7;
  long local_1d8 [2];
  undefined1 local_1c8 [376];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  memset((ostringstream *)local_1c8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  local_48 = 0;
  local_40 = 0;
  local_1e8 = (string)0x22;
  local_50 = &local_40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1e8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"webots_velocity_message_size",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_50,&local_1e8);
  if ((long *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
    operator_delete((long *)CONCAT71(uStack_1e7,local_1e8),local_1d8[0] + 1);
  }
  puVar1 = local_50;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b2d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x11a;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
  memset((ostringstream *)local_1c8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  local_48 = 0;
  local_40 = 0;
  local_1e8 = (string)0x22;
  local_50 = &local_40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1e8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"webots_velocity_message_size",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_50,&local_1e8);
  if ((long *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
    operator_delete((long *)CONCAT71(uStack_1e7,local_1e8),local_1d8[0] + 1);
  }
  puVar1 = local_50;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b2d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x11a;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
  memset((ostringstream *)local_1c8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  local_48 = 0;
  local_40 = 0;
  local_1e8 = (string)0x22;
  local_50 = &local_40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1e8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"webots_velocity_message_size",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_50,&local_1e8);
  if ((long *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
    operator_delete((long *)CONCAT71(uStack_1e7,local_1e8),local_1d8[0] + 1);
  }
  puVar1 = local_50;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b2d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x11a;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  this = (ios_base *)(local_1c8 + 0x70);
  std::ios_base::~ios_base(this);
  webots_velocity_message_size::test_method((webots_velocity_message_size *)this);
  memset((ostringstream *)local_1c8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  local_48 = 0;
  local_40 = 0;
  local_1e8 = (string)0x22;
  local_50 = &local_40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1e8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"webots_velocity_message_size",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_50,&local_1e8);
  if ((long *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
    operator_delete((long *)CONCAT71(uStack_1e7,local_1e8),local_1d8[0] + 1);
  }
  puVar1 = local_50;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b2d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x11a;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
  memset((ostringstream *)local_1c8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  local_48 = 0;
  local_40 = 0;
  local_1e8 = (string)0x22;
  local_50 = &local_40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1e8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"webots_velocity_message_size",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_50,&local_1e8);
  if ((long *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
    operator_delete((long *)CONCAT71(uStack_1e7,local_1e8),local_1d8[0] + 1);
  }
  puVar1 = local_50;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b2d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x11a;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(webots_velocity_message_size)
{
    webots_velocity_message msg;
    BOOST_TEST(msg.body_size() == 2 * sizeof(double));
}